

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::metrics::MetricsTest_testTimer_Test::TestBody(MetricsTest_testTimer_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this_00;
  bool bVar1;
  pointer pTVar2;
  char *pcVar3;
  pointer pvVar4;
  AssertHelper local_150 [8];
  Message local_148 [8];
  undefined1 local_140 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_110 [8];
  Message local_108 [8];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  key_type local_d8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  local_b8;
  const_iterator itr;
  AssertHelper local_a8 [8];
  Message local_a0 [8];
  size_type local_98;
  int local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  ValueMap *timers;
  allocator local_59;
  string local_58 [32];
  unique_ptr<jaegertracing::metrics::Timer,_std::default_delete<jaegertracing::metrics::Timer>_>
  local_38;
  unique_ptr<jaegertracing::metrics::Timer,_std::default_delete<jaegertracing::metrics::Timer>_>
  timer;
  StatsFactoryImpl factory;
  char *metricName;
  int64_t timeValue;
  MetricsTest_testTimer_Test *this_local;
  
  metricName = (char *)0x5;
  timeValue = (int64_t)this;
  jaegertracing::metrics::StatsFactoryImpl::StatsFactoryImpl
            ((StatsFactoryImpl *)&timer,(StatsReporter *)&(this->super_MetricsTest)._metricsReporter
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"jaeger.test-timer",&local_59);
  jaegertracing::metrics::StatsFactory::createTimer((string *)&local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pTVar2 = std::
           unique_ptr<jaegertracing::metrics::Timer,_std::default_delete<jaegertracing::metrics::Timer>_>
           ::operator->(&local_38);
  (*pTVar2->_vptr_Timer[2])(pTVar2,5);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       InMemoryStatsReporter::timers_abi_cxx11_(&(this->super_MetricsTest)._metricsReporter);
  local_8c = 1;
  local_98 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)gtest_ar.message_.ptr_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_88,"1","timers.size()",&local_8c,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
               ,0x52,pcVar3);
    testing::internal::AssertHelper::operator=(local_a8,local_a0);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    testing::Message::~Message(local_a0);
  }
  itr.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  ._M_cur._5_3_ = 0;
  itr.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
  ._M_cur._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  this_00 = gtest_ar.message_;
  if (itr.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
      ._M_cur._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d8,"jaeger.test-timer",
               (allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 *)this_00.ptr_,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
    local_100._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<std::__cxx11::string,long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>>
                   ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)gtest_ar.message_.ptr_);
    local_f1 = std::__detail::operator!=(&local_b8,&local_100);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_f0,&local_f1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&gtest_ar_1.message_,local_f0,"itr != std::end(timers)","false")
      ;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_110,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                 ,0x54,pcVar3);
      testing::internal::AssertHelper::operator=(local_110,local_108);
      testing::internal::AssertHelper::~AssertHelper(local_110);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(local_108);
    }
    itr.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
    ._M_cur._5_3_ = 0;
    itr.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
    ._M_cur._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    if (itr.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
        ._M_cur._4_4_ == 0) {
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_false,_true>
                             *)&local_b8);
      testing::internal::EqHelper<false>::Compare<long,long>
                ((EqHelper<false> *)local_140,"timeValue","itr->second",(long *)&metricName,
                 &pvVar4->second);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
      if (!bVar1) {
        testing::Message::Message(local_148);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
        testing::internal::AssertHelper::AssertHelper
                  (local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                   ,0x55,pcVar3);
        testing::internal::AssertHelper::operator=(local_150,local_148);
        testing::internal::AssertHelper::~AssertHelper(local_150);
        testing::Message::~Message(local_148);
      }
      itr.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
      ._M_cur._5_3_ = 0;
      itr.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
      ._M_cur._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
      if (itr.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
          ._M_cur._4_4_ == 0) {
        itr.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
        ._M_cur._4_4_ = 0;
      }
    }
  }
  std::
  unique_ptr<jaegertracing::metrics::Timer,_std::default_delete<jaegertracing::metrics::Timer>_>::
  ~unique_ptr(&local_38);
  StatsFactoryImpl::~StatsFactoryImpl((StatsFactoryImpl *)&timer);
  return;
}

Assistant:

TEST_F(MetricsTest, testTimer)
{
    constexpr auto timeValue = static_cast<int64_t>(5);
    constexpr auto metricName = "jaeger.test-timer";
    StatsFactoryImpl factory(_metricsReporter);
    auto timer = factory.createTimer(metricName);
    timer->record(timeValue);
    const auto& timers = _metricsReporter.timers();
    ASSERT_EQ(1, timers.size());
    auto itr = timers.find(metricName);
    ASSERT_TRUE(itr != std::end(timers));
    ASSERT_EQ(timeValue, itr->second);
}